

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaBasicItemPtr
xmlSchemaParseElement
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int *isElemRef,
          int topLevel)

{
  xmlSchemaIDCPtr_conflict pxVar1;
  xmlAttrPtr attr_00;
  xmlSchemaPtr ctxt_00;
  int iVar2;
  xmlSchemaTypePtr pxVar3;
  xmlChar *pxVar4;
  bool bVar5;
  xmlSchemaIDCPtr_conflict lastIDC;
  xmlSchemaIDCPtr_conflict curIDC;
  xmlChar *attrValue;
  xmlChar *name;
  xmlChar *fixed;
  xmlChar *ns;
  xmlSchemaQNameRefPtr refer;
  xmlChar *ref;
  xmlChar *refNs;
  xmlChar *des;
  int local_70;
  int isRef;
  int max;
  int min;
  xmlAttrPtr nameAttr;
  xmlAttrPtr attr;
  xmlNodePtr child;
  xmlSchemaAnnotPtr annot;
  xmlSchemaParticlePtr particle;
  xmlSchemaElementPtr decl;
  int *piStack_30;
  int topLevel_local;
  int *isElemRef_local;
  xmlNodePtr node_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  particle = (xmlSchemaParticlePtr)0x0;
  annot = (xmlSchemaAnnotPtr)0x0;
  child = (xmlNodePtr)0x0;
  attr = (xmlAttrPtr)0x0;
  des._4_4_ = 0;
  refNs = (xmlChar *)0x0;
  if (((ctxt == (xmlSchemaParserCtxtPtr)0x0) || (schema == (xmlSchemaPtr)0x0)) ||
     (node == (xmlNodePtr)0x0)) {
    return (xmlSchemaBasicItemPtr)0x0;
  }
  if (isElemRef != (int *)0x0) {
    *isElemRef = 0;
  }
  decl._4_4_ = topLevel;
  piStack_30 = isElemRef;
  isElemRef_local = (int *)node;
  node_local = (xmlNodePtr)schema;
  schema_local = (xmlSchemaPtr)ctxt;
  _max = xmlSchemaGetPropNode(node,"name");
  nameAttr = xmlSchemaGetPropNode((xmlNodePtr)isElemRef_local,"ref");
  if ((decl._4_4_ == 0) && (nameAttr != (xmlAttrPtr)0x0)) {
    des._4_4_ = 1;
  }
  else if (_max == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_MISSING,
               (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)isElemRef_local,"name",(char *)0x0);
    return (xmlSchemaBasicItemPtr)0x0;
  }
  xmlSchemaPValAttrID((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)isElemRef_local,"id");
  attr = *(xmlAttrPtr *)(isElemRef_local + 6);
  if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
     ((iVar2 = xmlStrEqual(attr->name,"annotation"), iVar2 != 0 &&
      (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 != 0)))) {
    child = (xmlNodePtr)
            xmlSchemaParseAnnotation((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)attr,1);
    attr = attr->next;
  }
  if (decl._4_4_ == 0) {
    isRef = xmlGetMinOccurs((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)isElemRef_local,0,-1,1,
                            "xs:nonNegativeInteger");
    local_70 = xmlGetMaxOccurs((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)isElemRef_local,0,
                               0x40000000,1,"(xs:nonNegativeInteger | unbounded)");
    xmlSchemaPCheckParticleCorrect_2
              ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaParticlePtr)0x0,
               (xmlNodePtr)isElemRef_local,isRef,local_70);
    annot = (xmlSchemaAnnotPtr)
            xmlSchemaAddParticle
                      ((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)isElemRef_local,isRef,
                       local_70);
    if ((xmlSchemaParticlePtr)annot == (xmlSchemaParticlePtr)0x0) goto LAB_00219bb7;
    if (des._4_4_ != 0) {
      ref = (xmlChar *)0x0;
      refer = (xmlSchemaQNameRefPtr)0x0;
      ns = (xmlChar *)0x0;
      if (piStack_30 != (int *)0x0) {
        *piStack_30 = 1;
      }
      xmlSchemaPValAttrNodeQName
                ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                 (xmlSchemaBasicItemPtr)0x0,nameAttr,&ref,(xmlChar **)&refer);
      xmlSchemaCheckReference
                ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                 (xmlNodePtr)isElemRef_local,nameAttr,ref);
      if (_max != (xmlAttrPtr)0x0) {
        xmlSchemaPMutualExclAttrErr
                  ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_SRC_ELEMENT_2_1,
                   (xmlSchemaBasicItemPtr)0x0,_max,"ref","name");
      }
      nameAttr = *(xmlAttrPtr *)(isElemRef_local + 0x16);
      while (nameAttr != (xmlAttrPtr)0x0) {
        if (nameAttr->ns == (xmlNs *)0x0) {
          iVar2 = xmlStrEqual(nameAttr->name,"ref");
          if ((((iVar2 == 0) && (iVar2 = xmlStrEqual(nameAttr->name,"name"), iVar2 == 0)) &&
              (iVar2 = xmlStrEqual(nameAttr->name,"id"), iVar2 == 0)) &&
             ((iVar2 = xmlStrEqual(nameAttr->name,(xmlChar *)"maxOccurs"), iVar2 == 0 &&
              (iVar2 = xmlStrEqual(nameAttr->name,(xmlChar *)"minOccurs"), iVar2 == 0)))) {
            xmlSchemaPCustomAttrErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_SRC_ELEMENT_2_2,
                       (xmlChar **)0x0,(xmlSchemaBasicItemPtr)0x0,nameAttr,
                       "Only the attributes \'minOccurs\', \'maxOccurs\' and \'id\' are allowed in addition to \'ref\'"
                      );
            break;
          }
          nameAttr = nameAttr->next;
        }
        else {
          iVar2 = xmlStrEqual(nameAttr->ns->href,xmlSchemaNs);
          if (iVar2 != 0) {
            xmlSchemaPIllegalAttrErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                       (xmlSchemaBasicItemPtr)0x0,nameAttr);
          }
          nameAttr = nameAttr->next;
        }
      }
      if (attr != (xmlAttrPtr)0x0) {
        xmlSchemaPContentErr
                  ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                   (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)isElemRef_local,(xmlNodePtr)attr,
                   (char *)0x0,"(annotation?)");
      }
      if ((isRef != 0) || (local_70 != 0)) {
        ns = (xmlChar *)
             xmlSchemaNewQNameRef
                       ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMA_TYPE_ELEMENT,
                        (xmlChar *)refer,ref);
        if ((xmlNodePtr)ns != (xmlNodePtr)0x0) {
          annot[1].content = (xmlNodePtr)ns;
          annot->content = child;
          xmlSchemaAddItemSize
                    ((xmlSchemaItemListPtr *)(*(long *)&schema_local->flags + 0x28),10,annot);
          return (xmlSchemaBasicItemPtr)annot;
        }
        ns = (xmlChar *)0x0;
      }
      goto LAB_00219bb7;
    }
  }
  ctxt_00 = schema_local;
  attr_00 = _max;
  fixed = (xmlChar *)0x0;
  lastIDC = (xmlSchemaIDCPtr_conflict)0x0;
  pxVar3 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
  iVar2 = xmlSchemaPValAttrNode
                    ((xmlSchemaParserCtxtPtr)ctxt_00,(xmlSchemaBasicItemPtr)0x0,attr_00,pxVar3,
                     &attrValue);
  if (iVar2 == 0) {
    if (decl._4_4_ == 0) {
      nameAttr = xmlSchemaGetPropNode((xmlNodePtr)isElemRef_local,"form");
      if ((xmlNodePtr)nameAttr == (xmlNodePtr)0x0) {
        if (((ulong)node_local->next & 1) != 0) {
          fixed = (xmlChar *)schema_local[1].annot;
        }
      }
      else {
        pxVar4 = xmlSchemaGetNodeContent((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)nameAttr);
        iVar2 = xmlStrEqual(pxVar4,"qualified");
        if (iVar2 == 0) {
          iVar2 = xmlStrEqual(pxVar4,(xmlChar *)"unqualified");
          if (iVar2 == 0) {
            xmlSchemaPSimpleTypeErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                       (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)nameAttr,(xmlSchemaTypePtr)0x0,
                       "(qualified | unqualified)",pxVar4,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0)
            ;
          }
        }
        else {
          fixed = (xmlChar *)schema_local[1].annot;
        }
      }
    }
    else {
      fixed = (xmlChar *)schema_local[1].annot;
    }
    particle = (xmlSchemaParticlePtr)
               xmlSchemaAddElement((xmlSchemaParserCtxtPtr)schema_local,attrValue,fixed,
                                   (xmlNodePtr)isElemRef_local,decl._4_4_);
    if ((xmlSchemaElementPtr)particle != (xmlSchemaElementPtr)0x0) {
      for (nameAttr = *(xmlAttrPtr *)(isElemRef_local + 0x16); nameAttr != (xmlAttrPtr)0x0;
          nameAttr = nameAttr->next) {
        if (nameAttr->ns == (xmlNs *)0x0) {
          iVar2 = xmlStrEqual(nameAttr->name,"name");
          if ((((iVar2 == 0) && (iVar2 = xmlStrEqual(nameAttr->name,"type"), iVar2 == 0)) &&
              (iVar2 = xmlStrEqual(nameAttr->name,"id"), iVar2 == 0)) &&
             (((iVar2 = xmlStrEqual(nameAttr->name,"default"), iVar2 == 0 &&
               (iVar2 = xmlStrEqual(nameAttr->name,(xmlChar *)"fixed"), iVar2 == 0)) &&
              ((iVar2 = xmlStrEqual(nameAttr->name,"block"), iVar2 == 0 &&
               (iVar2 = xmlStrEqual(nameAttr->name,(xmlChar *)"nillable"), iVar2 == 0)))))) {
            if (decl._4_4_ == 0) {
              iVar2 = xmlStrEqual(nameAttr->name,(xmlChar *)"maxOccurs");
              if (((iVar2 == 0) &&
                  (iVar2 = xmlStrEqual(nameAttr->name,(xmlChar *)"minOccurs"), iVar2 == 0)) &&
                 (iVar2 = xmlStrEqual(nameAttr->name,"form"), iVar2 == 0)) {
                xmlSchemaPIllegalAttrErr
                          ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                           (xmlSchemaBasicItemPtr)0x0,nameAttr);
              }
            }
            else {
              iVar2 = xmlStrEqual(nameAttr->name,(xmlChar *)"final");
              if (((iVar2 == 0) && (iVar2 = xmlStrEqual(nameAttr->name,"abstract"), iVar2 == 0)) &&
                 (iVar2 = xmlStrEqual(nameAttr->name,(xmlChar *)"substitutionGroup"), iVar2 == 0)) {
                xmlSchemaPIllegalAttrErr
                          ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                           (xmlSchemaBasicItemPtr)0x0,nameAttr);
              }
            }
          }
        }
        else {
          iVar2 = xmlStrEqual(nameAttr->ns->href,xmlSchemaNs);
          if (iVar2 != 0) {
            xmlSchemaPIllegalAttrErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED,
                       (xmlSchemaBasicItemPtr)0x0,nameAttr);
          }
        }
      }
      if (decl._4_4_ != 0) {
        *(uint *)&particle[1].node = *(uint *)&particle[1].node | 2;
        *(uint *)&particle[1].node = *(uint *)&particle[1].node | 0x20;
        xmlSchemaPValAttrQName
                  ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                   (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)isElemRef_local,"substitutionGroup",
                   (xmlChar **)&particle[2].minOccurs,(xmlChar **)&particle[2].children);
        iVar2 = xmlGetBooleanProp((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)isElemRef_local,
                                  "abstract",0);
        if (iVar2 != 0) {
          *(uint *)&particle[1].node = *(uint *)&particle[1].node | 0x10;
        }
        nameAttr = xmlSchemaGetPropNode((xmlNodePtr)isElemRef_local,"final");
        if ((xmlNodePtr)nameAttr == (xmlNodePtr)0x0) {
          if (((ulong)node_local->next & 4) != 0) {
            *(uint *)&particle[1].node = *(uint *)&particle[1].node | 0x8000;
          }
          if (((ulong)node_local->next & 8) != 0) {
            *(uint *)&particle[1].node = *(uint *)&particle[1].node | 0x10000;
          }
        }
        else {
          pxVar4 = xmlSchemaGetNodeContent
                             ((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)nameAttr);
          iVar2 = xmlSchemaPValAttrBlockFinal
                            (pxVar4,(int *)&particle[1].node,-1,0x8000,0x10000,-1,-1,-1);
          if (iVar2 != 0) {
            xmlSchemaPSimpleTypeErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                       (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)nameAttr,(xmlSchemaTypePtr)0x0,
                       "(#all | List of (extension | restriction))",pxVar4,(char *)0x0,
                       (xmlChar *)0x0,(xmlChar *)0x0);
          }
        }
      }
      nameAttr = xmlSchemaGetPropNode((xmlNodePtr)isElemRef_local,"block");
      if ((xmlNodePtr)nameAttr == (xmlNodePtr)0x0) {
        if (((ulong)node_local->next & 0x80) != 0) {
          *(uint *)&particle[1].node = *(uint *)&particle[1].node | 0x1000;
        }
        if (((ulong)node_local->next & 0x40) != 0) {
          *(uint *)&particle[1].node = *(uint *)&particle[1].node | 0x800;
        }
        if (((ulong)node_local->next & 0x100) != 0) {
          *(uint *)&particle[1].node = *(uint *)&particle[1].node | 0x2000;
        }
      }
      else {
        pxVar4 = xmlSchemaGetNodeContent((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)nameAttr);
        iVar2 = xmlSchemaPValAttrBlockFinal
                          (pxVar4,(int *)&particle[1].node,-1,0x800,0x1000,0x2000,-1,-1);
        if (iVar2 != 0) {
          xmlSchemaPSimpleTypeErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                     (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)nameAttr,(xmlSchemaTypePtr)0x0,
                     "(#all | List of (extension | restriction | substitution))",pxVar4,(char *)0x0,
                     (xmlChar *)0x0,(xmlChar *)0x0);
        }
      }
      iVar2 = xmlGetBooleanProp((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)isElemRef_local,
                                "nillable",0);
      if (iVar2 != 0) {
        *(uint *)&particle[1].node = *(uint *)&particle[1].node | 1;
      }
      nameAttr = xmlSchemaGetPropNode((xmlNodePtr)isElemRef_local,"type");
      if (nameAttr != (xmlAttrPtr)0x0) {
        xmlSchemaPValAttrNodeQName
                  ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                   (xmlSchemaBasicItemPtr)0x0,nameAttr,(xmlChar **)&particle[2].next,
                   (xmlChar **)&particle[2].annot);
        xmlSchemaCheckReference
                  ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                   (xmlNodePtr)isElemRef_local,nameAttr,(xmlChar *)particle[2].next);
      }
      pxVar4 = xmlSchemaGetProp((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)isElemRef_local,
                                "default");
      *(xmlChar **)(particle + 3) = pxVar4;
      nameAttr = xmlSchemaGetPropNode((xmlNodePtr)isElemRef_local,"fixed");
      if ((xmlNodePtr)nameAttr != (xmlNodePtr)0x0) {
        name = xmlSchemaGetNodeContent((xmlSchemaParserCtxtPtr)schema_local,(xmlNodePtr)nameAttr);
        if (*(long *)(particle + 3) == 0) {
          *(uint *)&particle[1].node = *(uint *)&particle[1].node | 8;
          *(xmlChar **)(particle + 3) = name;
        }
        else {
          xmlSchemaPMutualExclAttrErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_SRC_ELEMENT_1,
                     (xmlSchemaBasicItemPtr)0x0,nameAttr,"default","fixed");
        }
      }
      if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
         ((iVar2 = xmlStrEqual(attr->name,(xmlChar *)"complexType"), iVar2 == 0 ||
          (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 == 0)))) {
        if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
           ((iVar2 = xmlStrEqual(attr->name,"simpleType"), iVar2 != 0 &&
            (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 != 0)))) {
          if (particle[2].annot == (xmlSchemaAnnotPtr)0x0) {
            pxVar3 = xmlSchemaParseSimpleType
                               ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                (xmlNodePtr)attr,0);
            particle[1].annot = (xmlSchemaAnnotPtr)pxVar3;
          }
          else {
            xmlSchemaPContentErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_SRC_ELEMENT_3,
                       (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)isElemRef_local,(xmlNodePtr)attr,
                       "The attribute \'type\' and the <simpleType> child are mutually exclusive",
                       (char *)0x0);
          }
          attr = attr->next;
        }
      }
      else {
        if (particle[2].annot == (xmlSchemaAnnotPtr)0x0) {
          pxVar3 = xmlSchemaParseComplexType
                             ((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                              (xmlNodePtr)attr,0);
          particle[1].annot = (xmlSchemaAnnotPtr)pxVar3;
        }
        else {
          xmlSchemaPContentErr
                    ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_SRC_ELEMENT_3,
                     (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)isElemRef_local,(xmlNodePtr)attr,
                     "The attribute \'type\' and the <complexType> child are mutually exclusive",
                     (char *)0x0);
        }
        attr = attr->next;
      }
      do {
        pxVar1 = lastIDC;
        if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
           (iVar2 = xmlStrEqual(attr->name,(xmlChar *)"unique"), iVar2 == 0)) {
LAB_002198bf:
          if (((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
             (iVar2 = xmlStrEqual(attr->name,"key"), iVar2 != 0)) {
            iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs);
            bVar5 = true;
            if (iVar2 != 0) goto LAB_00219986;
          }
          bVar5 = false;
          if ((attr != (xmlAttrPtr)0x0) && (bVar5 = false, attr->ns != (xmlNs *)0x0)) {
            iVar2 = xmlStrEqual(attr->name,"keyref");
            bVar5 = false;
            if (iVar2 != 0) {
              iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs);
              bVar5 = iVar2 != 0;
            }
          }
        }
        else {
          iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs);
          bVar5 = true;
          if (iVar2 == 0) goto LAB_002198bf;
        }
LAB_00219986:
        if (!bVar5) {
          if (attr != (xmlAttrPtr)0x0) {
            xmlSchemaPContentErr
                      ((xmlSchemaParserCtxtPtr)schema_local,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
                       (xmlSchemaBasicItemPtr)0x0,(xmlNodePtr)isElemRef_local,(xmlNodePtr)attr,
                       (char *)0x0,
                       "(annotation?, ((simpleType | complexType)?, (unique | key | keyref)*))");
          }
          *(xmlNodePtr *)(particle + 1) = child;
          if (refNs != (xmlChar *)0x0) {
            (*xmlFree)(refNs);
          }
          if (decl._4_4_ != 0) {
            return (xmlSchemaBasicItemPtr)particle;
          }
          annot[1].content = (xmlNodePtr)particle;
          return (xmlSchemaBasicItemPtr)annot;
        }
        if ((((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
            (iVar2 = xmlStrEqual(attr->name,(xmlChar *)"unique"), iVar2 == 0)) ||
           (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 == 0)) {
          if (((attr == (xmlAttrPtr)0x0) || (attr->ns == (xmlNs *)0x0)) ||
             ((iVar2 = xmlStrEqual(attr->name,"key"), iVar2 == 0 ||
              (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 == 0)))) {
            if ((((attr != (xmlAttrPtr)0x0) && (attr->ns != (xmlNs *)0x0)) &&
                (iVar2 = xmlStrEqual(attr->name,"keyref"), iVar2 != 0)) &&
               (iVar2 = xmlStrEqual(attr->ns->href,xmlSchemaNs), iVar2 != 0)) {
              lastIDC = xmlSchemaParseIDC((xmlSchemaParserCtxtPtr)schema_local,
                                          (xmlSchemaPtr)node_local,(xmlNodePtr)attr,
                                          XML_SCHEMA_TYPE_IDC_KEYREF,*(xmlChar **)(particle + 2));
            }
          }
          else {
            lastIDC = xmlSchemaParseIDC((xmlSchemaParserCtxtPtr)schema_local,
                                        (xmlSchemaPtr)node_local,(xmlNodePtr)attr,
                                        XML_SCHEMA_TYPE_IDC_KEY,*(xmlChar **)(particle + 2));
          }
        }
        else {
          lastIDC = xmlSchemaParseIDC((xmlSchemaParserCtxtPtr)schema_local,(xmlSchemaPtr)node_local,
                                      (xmlNodePtr)attr,XML_SCHEMA_TYPE_IDC_UNIQUE,
                                      *(xmlChar **)(particle + 2));
        }
        if (pxVar1 == (xmlSchemaIDCPtr_conflict)0x0) {
          *(xmlSchemaIDCPtr_conflict *)(particle + 4) = lastIDC;
        }
        else {
          pxVar1->next = lastIDC;
        }
        attr = attr->next;
      } while( true );
    }
    particle = (xmlSchemaParticlePtr)0x0;
  }
LAB_00219bb7:
  if (refNs != (xmlChar *)0x0) {
    (*xmlFree)(refNs);
    refNs = (xmlChar *)0x0;
  }
  if (child != (xmlNodePtr)0x0) {
    if (annot != (xmlSchemaAnnotPtr)0x0) {
      annot->content = (xmlNodePtr)0x0;
    }
    if (particle != (xmlSchemaParticlePtr)0x0) {
      *(undefined8 *)(particle + 1) = 0;
    }
    xmlSchemaFreeAnnot((xmlSchemaAnnotPtr)child);
  }
  return (xmlSchemaBasicItemPtr)0x0;
}

Assistant:

static xmlSchemaBasicItemPtr
xmlSchemaParseElement(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                      xmlNodePtr node, int *isElemRef, int topLevel)
{
    xmlSchemaElementPtr decl = NULL;
    xmlSchemaParticlePtr particle = NULL;
    xmlSchemaAnnotPtr annot = NULL;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr, nameAttr;
    int min, max, isRef = 0;
    xmlChar *des = NULL;

    /* 3.3.3 Constraints on XML Representations of Element Declarations */
    /* TODO: Complete implementation of 3.3.6 */

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    if (isElemRef != NULL)
	*isElemRef = 0;
    /*
    * If we get a "ref" attribute on a local <element> we will assume it's
    * a reference - even if there's a "name" attribute; this seems to be more
    * robust.
    */
    nameAttr = xmlSchemaGetPropNode(node, "name");
    attr = xmlSchemaGetPropNode(node, "ref");
    if ((topLevel) || (attr == NULL)) {
	if (nameAttr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING,
		NULL, node, "name", NULL);
	    return (NULL);
	}
    } else
	isRef = 1;

    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    /*
    * Skip particle part if a global declaration.
    */
    if (topLevel)
	goto declaration_part;
    /*
    * The particle part ==================================================
    */
    min = xmlGetMinOccurs(ctxt, node, 0, -1, 1, "xs:nonNegativeInteger");
    max = xmlGetMaxOccurs(ctxt, node, 0, UNBOUNDED, 1, "(xs:nonNegativeInteger | unbounded)");
    xmlSchemaPCheckParticleCorrect_2(ctxt, NULL, node, min, max);
    particle = xmlSchemaAddParticle(ctxt, node, min, max);
    if (particle == NULL)
	goto return_null;

    /* ret->flags |= XML_SCHEMAS_ELEM_REF; */

    if (isRef) {
	const xmlChar *refNs = NULL, *ref = NULL;
	xmlSchemaQNameRefPtr refer = NULL;
	/*
	* The reference part =============================================
	*/
	if (isElemRef != NULL)
	    *isElemRef = 1;

	xmlSchemaPValAttrNodeQName(ctxt, schema,
	    NULL, attr, &refNs, &ref);
	xmlSchemaCheckReference(ctxt, schema, node, attr, refNs);
	/*
	* SPEC (3.3.3 : 2.1) "One of ref or name must be present, but not both"
	*/
	if (nameAttr != NULL) {
	    xmlSchemaPMutualExclAttrErr(ctxt,
		XML_SCHEMAP_SRC_ELEMENT_2_1, NULL, nameAttr, "ref", "name");
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if (xmlStrEqual(attr->name, BAD_CAST "ref") ||
		    xmlStrEqual(attr->name, BAD_CAST "name") ||
		    xmlStrEqual(attr->name, BAD_CAST "id") ||
		    xmlStrEqual(attr->name, BAD_CAST "maxOccurs") ||
		    xmlStrEqual(attr->name, BAD_CAST "minOccurs"))
		{
		    attr = attr->next;
		    continue;
		} else {
		    /* SPEC (3.3.3 : 2.2) */
		    xmlSchemaPCustomAttrErr(ctxt,
			XML_SCHEMAP_SRC_ELEMENT_2_2,
			NULL, NULL, attr,
			"Only the attributes 'minOccurs', 'maxOccurs' and "
			"'id' are allowed in addition to 'ref'");
		    break;
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* No children except <annotation> expected.
	*/
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt, XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child, NULL, "(annotation?)");
	}
	if ((min == 0) && (max == 0))
	    goto return_null;
	/*
	* Create the reference item and attach it to the particle.
	*/
	refer = xmlSchemaNewQNameRef(ctxt, XML_SCHEMA_TYPE_ELEMENT,
	    ref, refNs);
	if (refer == NULL)
	    goto return_null;
	particle->children = (xmlSchemaTreeItemPtr) refer;
	particle->annot = annot;
	/*
	* Add the particle to pending components, since the reference
	* need to be resolved.
	*/
	WXS_ADD_PENDING(ctxt, particle);
	return ((xmlSchemaBasicItemPtr) particle);
    }
    /*
    * The declaration part ===============================================
    */
declaration_part:
    {
	const xmlChar *ns = NULL, *fixed, *name, *attrValue;
	xmlSchemaIDCPtr curIDC = NULL, lastIDC = NULL;

	if (xmlSchemaPValAttrNode(ctxt, NULL, nameAttr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0)
	    goto return_null;
	/*
	* Evaluate the target namespace.
	*/
	if (topLevel) {
	    ns = ctxt->targetNamespace;
	} else {
	    attr = xmlSchemaGetPropNode(node, "form");
	    if (attr != NULL) {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlStrEqual(attrValue, BAD_CAST "qualified")) {
		    ns = ctxt->targetNamespace;
		} else if (!xmlStrEqual(attrValue, BAD_CAST "unqualified")) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(qualified | unqualified)",
			attrValue, NULL, NULL, NULL);
		}
	    } else if (schema->flags & XML_SCHEMAS_QUALIF_ELEM)
		ns = ctxt->targetNamespace;
	}
	decl = xmlSchemaAddElement(ctxt, name, ns, node, topLevel);
	if (decl == NULL) {
	    goto return_null;
	}
	/*
	* Check for illegal attributes.
	*/
	attr = node->properties;
	while (attr != NULL) {
	    if (attr->ns == NULL) {
		if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "type")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "id")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "default")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "fixed")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "block")) &&
		    (!xmlStrEqual(attr->name, BAD_CAST "nillable")))
		{
		    if (topLevel == 0) {
			if ((!xmlStrEqual(attr->name, BAD_CAST "maxOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "minOccurs")) &&
			    (!xmlStrEqual(attr->name, BAD_CAST "form")))
			{
			    xmlSchemaPIllegalAttrErr(ctxt,
				XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
			}
		    } else if ((!xmlStrEqual(attr->name, BAD_CAST "final")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "abstract")) &&
			(!xmlStrEqual(attr->name, BAD_CAST "substitutionGroup"))) {

			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		    }
		}
	    } else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {

		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	    attr = attr->next;
	}
	/*
	* Extract/validate attributes.
	*/
	if (topLevel) {
	    /*
	    * Process top attributes of global element declarations here.
	    */
	    decl->flags |= XML_SCHEMAS_ELEM_GLOBAL;
	    decl->flags |= XML_SCHEMAS_ELEM_TOPLEVEL;
	    xmlSchemaPValAttrQName(ctxt, schema,
		NULL, node, "substitutionGroup",
		&(decl->substGroupNs), &(decl->substGroup));
	    if (xmlGetBooleanProp(ctxt, node, "abstract", 0))
		decl->flags |= XML_SCHEMAS_ELEM_ABSTRACT;
	    /*
	    * Attribute "final".
	    */
	    attr = xmlSchemaGetPropNode(node, "final");
	    if (attr == NULL) {
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_EXTENSION;
		if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
		    decl->flags |= XML_SCHEMAS_ELEM_FINAL_RESTRICTION;
	    } else {
		attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
		if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		    -1,
		    XML_SCHEMAS_ELEM_FINAL_EXTENSION,
		    XML_SCHEMAS_ELEM_FINAL_RESTRICTION, -1, -1, -1) != 0) {
		    xmlSchemaPSimpleTypeErr(ctxt,
			XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			NULL, (xmlNodePtr) attr,
			NULL, "(#all | List of (extension | restriction))",
			attrValue, NULL, NULL, NULL);
		}
	    }
	}
	/*
	* Attribute "block".
	*/
	attr = xmlSchemaGetPropNode(node, "block");
	if (attr == NULL) {
	    /*
	    * Apply default "block" values.
	    */
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_RESTRICTION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_EXTENSION;
	    if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_SUBSTITUTION)
		decl->flags |= XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION;
	} else {
	    attrValue = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (xmlSchemaPValAttrBlockFinal(attrValue, &(decl->flags),
		-1,
		XML_SCHEMAS_ELEM_BLOCK_EXTENSION,
		XML_SCHEMAS_ELEM_BLOCK_RESTRICTION,
		XML_SCHEMAS_ELEM_BLOCK_SUBSTITUTION, -1, -1) != 0) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
		    NULL, (xmlNodePtr) attr,
		    NULL, "(#all | List of (extension | "
		    "restriction | substitution))", attrValue,
		    NULL, NULL, NULL);
	    }
	}
	if (xmlGetBooleanProp(ctxt, node, "nillable", 0))
	    decl->flags |= XML_SCHEMAS_ELEM_NILLABLE;

	attr = xmlSchemaGetPropNode(node, "type");
	if (attr != NULL) {
	    xmlSchemaPValAttrNodeQName(ctxt, schema,
		NULL, attr,
		&(decl->namedTypeNs), &(decl->namedType));
	    xmlSchemaCheckReference(ctxt, schema, node,
		attr, decl->namedTypeNs);
	}
	decl->value = xmlSchemaGetProp(ctxt, node, "default");
	attr = xmlSchemaGetPropNode(node, "fixed");
	if (attr != NULL) {
	    fixed = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
	    if (decl->value != NULL) {
		/*
		* 3.3.3 : 1
		* default and fixed must not both be present.
		*/
		xmlSchemaPMutualExclAttrErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_1,
		    NULL, attr, "default", "fixed");
	    } else {
		decl->flags |= XML_SCHEMAS_ELEM_FIXED;
		decl->value = fixed;
	    }
	}
	/*
	* And now for the children...
	*/
	if (IS_SCHEMA(child, "complexType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are mutually
	    * exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <complexType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseComplexType(ctxt, schema, child, 0);
	    child = child->next;
	} else if (IS_SCHEMA(child, "simpleType")) {
	    /*
	    * 3.3.3 : 3
	    * "type" and either <simpleType> or <complexType> are
	    * mutually exclusive
	    */
	    if (decl->namedType != NULL) {
		xmlSchemaPContentErr(ctxt,
		    XML_SCHEMAP_SRC_ELEMENT_3,
		    NULL, node, child,
		    "The attribute 'type' and the <simpleType> child are "
		    "mutually exclusive", NULL);
	    } else
		WXS_ELEM_TYPEDEF(decl) = xmlSchemaParseSimpleType(ctxt, schema, child, 0);
	    child = child->next;
	}
	while ((IS_SCHEMA(child, "unique")) ||
	    (IS_SCHEMA(child, "key")) || (IS_SCHEMA(child, "keyref"))) {
	    if (IS_SCHEMA(child, "unique")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_UNIQUE, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "key")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEY, decl->targetNamespace);
	    } else if (IS_SCHEMA(child, "keyref")) {
		curIDC = xmlSchemaParseIDC(ctxt, schema, child,
		    XML_SCHEMA_TYPE_IDC_KEYREF, decl->targetNamespace);
	    }
	    if (lastIDC != NULL)
		lastIDC->next = curIDC;
	    else
		decl->idcs = (void *) curIDC;
	    lastIDC = curIDC;
	    child = child->next;
	}
	if (child != NULL) {
	    xmlSchemaPContentErr(ctxt,
		XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
		NULL, node, child,
		NULL, "(annotation?, ((simpleType | complexType)?, "
		"(unique | key | keyref)*))");
	}
	decl->annot = annot;
    }
    /*
    * NOTE: Element Declaration Representation OK 4. will be checked at a
    * different layer.
    */
    FREE_AND_NULL(des)
    if (topLevel)
	return ((xmlSchemaBasicItemPtr) decl);
    else {
	particle->children = (xmlSchemaTreeItemPtr) decl;
	return ((xmlSchemaBasicItemPtr) particle);
    }

return_null:
    FREE_AND_NULL(des);
    if (annot != NULL) {
	if (particle != NULL)
	    particle->annot = NULL;
	if (decl != NULL)
	    decl->annot = NULL;
	xmlSchemaFreeAnnot(annot);
    }
    return (NULL);
}